

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void anon_unknown.dwarf_71625::findEdgePoints<double>
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               EdgeParameter *edgeParameter,
               vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *positiveEdgePoint
               ,vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                *negativeEdgePoint)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uchar *puVar4;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *point;
  vector<double,_std::allocator<double>_> *negative;
  vector<int,_std::allocator<int>_> *first;
  vector<double,_std::allocator<double>_> *this;
  uint in_ECX;
  size_t siglen;
  int in_EDX;
  uchar *sig;
  uint in_ESI;
  EVP_PKEY_CTX *ctx;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  EdgeParameter *in_R9;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  vector<double,_std::allocator<double>_> edgeNegative_1;
  vector<double,_std::allocator<double>_> edgePositive_1;
  uint32_t groupId_1;
  int *dataX_1;
  uint8_t *imageYEnd;
  uint8_t *imageY_1;
  uint32_t rowId_1;
  uint8_t *imageX_1;
  vector<int,_std::allocator<int>_> secondDerivative_1;
  vector<int,_std::allocator<int>_> firstDerivative_1;
  vector<int,_std::allocator<int>_> data_1;
  vector<double,_std::allocator<double>_> edgeNegative;
  vector<double,_std::allocator<double>_> edgePositive;
  uint32_t groupId;
  int *dataX;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  uint32_t rowId;
  uint8_t *imageY;
  vector<int,_std::allocator<int>_> secondDerivative;
  vector<int,_std::allocator<int>_> firstDerivative;
  vector<int,_std::allocator<int>_> data;
  uint32_t rowSize;
  bool horizontalEdgeDetectionBase;
  undefined8 in_stack_fffffffffffffdb0;
  undefined1 forwardDirection;
  EdgeParameter *in_stack_fffffffffffffdb8;
  EdgeParameter *edgeParameter_00;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffdc0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc8;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffdd0;
  vector<int,_std::allocator<int>_> *this_00;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *in_stack_fffffffffffffdd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  vector<double,_std::allocator<double>_> *positive;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *in_stack_fffffffffffffde8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf0;
  vector<double,_std::allocator<double>_> *data_00;
  bool local_1b9;
  EdgeParameter local_1b8;
  uint local_184;
  uint *local_180;
  byte *local_178;
  byte *local_170;
  uint local_164;
  byte *local_160;
  vector<int,_std::allocator<int>_> local_155;
  vector<double,_std::allocator<double>_> local_135;
  vector<double,_std::allocator<double>_> local_111 [3];
  uint local_c4;
  uint *local_c0;
  byte *local_b8;
  byte *local_b0;
  uint local_a4;
  byte *local_a0;
  undefined4 local_94;
  undefined4 local_74;
  uint32_t local_28;
  bool local_21;
  EdgeParameter *local_20;
  uint local_18;
  uint local_14;
  int local_10;
  uint local_c;
  ImageTemplate<unsigned_char> *local_8;
  
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffdc0);
  ctx = (EVP_PKEY_CTX *)(ulong)local_c;
  siglen = (size_t)local_14;
  puVar4 = (uchar *)(ulong)local_18;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffdd0,(uint32_t)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffdc8,
             (uint32_t)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
             (uint32_t)in_stack_fffffffffffffdc0);
  EdgeParameter::verify(local_20,ctx,sig,siglen,puVar4,(size_t)in_R9);
  local_1b9 = true;
  if (local_20->direction != LEFT_TO_RIGHT) {
    local_1b9 = local_20->direction == RIGHT_TO_LEFT;
  }
  local_21 = local_1b9;
  if (((local_1b9 == false) || (3 < local_14)) && ((local_1b9 != false || (3 < local_18)))) {
    local_28 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_8);
    if ((local_21 & 1U) == 0) {
      point = (vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)(ulong)local_18;
      data_00 = local_111;
      std::allocator<int>::allocator((allocator<int> *)0x131534);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
                 (size_type)in_stack_fffffffffffffdc8,(allocator_type *)in_stack_fffffffffffffdc0);
      std::allocator<int>::~allocator((allocator<int> *)0x13155a);
      negative = (vector<double,_std::allocator<double>_> *)(ulong)local_18;
      local_135.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._1_4_ = 0;
      positive = &local_135;
      std::allocator<int>::allocator((allocator<int> *)0x131583);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
                 (size_type)in_stack_fffffffffffffdc8,
                 (value_type_conflict3 *)in_stack_fffffffffffffdc0,
                 (allocator_type *)in_stack_fffffffffffffdb8);
      std::allocator<int>::~allocator((allocator<int> *)0x1315b1);
      first = (vector<int,_std::allocator<int>_> *)(ulong)local_18;
      local_155.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._1_4_ = 0;
      this_00 = &local_155;
      std::allocator<int>::allocator((allocator<int> *)0x1315da);
      std::vector<int,_std::allocator<int>_>::vector
                (this_00,(size_type)first,(value_type_conflict3 *)in_stack_fffffffffffffdc0,
                 (allocator_type *)in_stack_fffffffffffffdb8);
      std::allocator<int>::~allocator((allocator<int> *)0x131608);
      this = (vector<double,_std::allocator<double>_> *)
             PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
      local_160 = (byte *)((long)&(this->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_c + (ulong)(local_10 * local_28));
      for (local_164 = 0; local_164 < (local_14 - local_20->groupFactor) + 1;
          local_164 = local_20->skipFactor + local_164) {
        local_170 = local_160;
        local_178 = local_160 + local_18 * local_28;
        local_180 = (uint *)std::vector<int,_std::allocator<int>_>::data
                                      ((vector<int,_std::allocator<int>_> *)0x1316b7);
        for (; local_170 != local_178; local_170 = local_170 + local_28) {
          *local_180 = (uint)*local_170;
          local_180 = local_180 + 1;
        }
        for (local_184 = 1; local_184 < local_20->groupFactor; local_184 = local_184 + 1) {
          local_170 = local_160 + local_184;
          local_178 = local_170 + local_18 * local_28;
          local_180 = (uint *)std::vector<int,_std::allocator<int>_>::data
                                        ((vector<int,_std::allocator<int>_> *)0x131815);
          for (; local_170 != local_178; local_170 = local_170 + local_28) {
            *local_180 = (uint)*local_170 + *local_180;
            local_180 = local_180 + 1;
          }
        }
        forwardDirection = (undefined1)((ulong)&local_1b8.contrastCheckRightSideOffset >> 0x38);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x1318a2);
        edgeParameter_00 = &local_1b8;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x1318b4);
        findEdgePoints<double>
                  (positive,negative,this_00,first,(vector<int,_std::allocator<int>_> *)this,
                   edgeParameter_00,(bool)forwardDirection);
        if (local_20->direction == TOP_TO_BOTTOM) {
          if ((local_20->gradient == POSITIVE) || (local_20->gradient == ANY)) {
            auVar2 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,local_c + local_164);
            auVar3 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,local_20->groupFactor - 1);
            fVar1 = auVar2._0_4_ + auVar3._0_4_ * 0.5;
            in_ZMM0 = ZEXT1664(CONCAT88(auVar2._8_8_,(double)fVar1));
            auVar2 = vcvtusi2sd_avx512f(ZEXT416((uint)fVar1),local_10);
            in_ZMM1 = ZEXT1664(auVar2);
            createPositiveYEdge<double>(data_00,point,(double)positive,(double)negative);
          }
          if ((local_20->gradient == NEGATIVE) || (local_20->gradient == ANY)) {
            auVar2 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,local_c + local_164);
            auVar3 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,local_20->groupFactor - 1);
            fVar1 = auVar2._0_4_ + auVar3._0_4_ * 0.5;
            in_ZMM0 = ZEXT1664(CONCAT88(auVar2._8_8_,(double)fVar1));
            auVar2 = vcvtusi2sd_avx512f(ZEXT416((uint)fVar1),local_10 + -1 + local_18);
            in_ZMM1 = ZEXT1664(auVar2);
            createNegativeYEdge<double>(data_00,point,(double)positive,(double)negative);
          }
        }
        else {
          if ((local_20->gradient == POSITIVE) || (local_20->gradient == ANY)) {
            auVar2 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,local_c + local_164);
            auVar3 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,local_20->groupFactor - 1);
            fVar1 = auVar2._0_4_ + auVar3._0_4_ * 0.5;
            in_ZMM0 = ZEXT1664(CONCAT88(auVar2._8_8_,(double)fVar1));
            auVar2 = vcvtusi2sd_avx512f(ZEXT416((uint)fVar1),local_10 + -1 + local_18);
            in_ZMM1 = ZEXT1664(auVar2);
            createNegativeYEdge<double>(data_00,point,(double)positive,(double)negative);
          }
          if ((local_20->gradient == NEGATIVE) || (local_20->gradient == ANY)) {
            auVar2 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,local_c + local_164);
            auVar3 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,local_20->groupFactor - 1);
            fVar1 = auVar2._0_4_ + auVar3._0_4_ * 0.5;
            in_ZMM0 = ZEXT1664(CONCAT88(auVar2._8_8_,(double)fVar1));
            auVar2 = vcvtusi2sd_avx512f(ZEXT416((uint)fVar1),local_10);
            in_ZMM1 = ZEXT1664(auVar2);
            createPositiveYEdge<double>(data_00,point,(double)positive,(double)negative);
          }
        }
        std::vector<double,_std::allocator<double>_>::~vector(this);
        std::vector<double,_std::allocator<double>_>::~vector(this);
        local_160 = local_160 + local_20->skipFactor;
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    }
    else {
      std::allocator<int>::allocator((allocator<int> *)0x130e46);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
                 (size_type)in_stack_fffffffffffffdc8,(allocator_type *)in_stack_fffffffffffffdc0);
      std::allocator<int>::~allocator((allocator<int> *)0x130e72);
      local_74 = 0;
      std::allocator<int>::allocator((allocator<int> *)0x130e9e);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
                 (size_type)in_stack_fffffffffffffdc8,
                 (value_type_conflict3 *)in_stack_fffffffffffffdc0,
                 (allocator_type *)in_stack_fffffffffffffdb8);
      std::allocator<int>::~allocator((allocator<int> *)0x130ecf);
      local_94 = 0;
      std::allocator<int>::allocator((allocator<int> *)0x130ef8);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
                 (size_type)in_stack_fffffffffffffdc8,
                 (value_type_conflict3 *)in_stack_fffffffffffffdc0,
                 (allocator_type *)in_stack_fffffffffffffdb8);
      std::allocator<int>::~allocator((allocator<int> *)0x130f26);
      puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
      local_a0 = puVar4 + (ulong)local_c + (ulong)(local_10 * local_28);
      for (local_a4 = 0; local_a4 < (local_18 - local_20->groupFactor) + 1;
          local_a4 = local_20->skipFactor + local_a4) {
        local_b0 = local_a0;
        local_b8 = local_a0 + local_14;
        local_c0 = (uint *)std::vector<int,_std::allocator<int>_>::data
                                     ((vector<int,_std::allocator<int>_> *)0x130fcb);
        for (; local_b0 != local_b8; local_b0 = local_b0 + 1) {
          *local_c0 = (uint)*local_b0;
          local_c0 = local_c0 + 1;
        }
        for (local_c4 = 1; local_c4 < local_20->groupFactor; local_c4 = local_c4 + 1) {
          local_b0 = local_a0 + local_c4 * local_28;
          local_b8 = local_b0 + local_14;
          local_c0 = (uint *)std::vector<int,_std::allocator<int>_>::data
                                       ((vector<int,_std::allocator<int>_> *)0x131121);
          for (; local_b0 != local_b8; local_b0 = local_b0 + 1) {
            *local_c0 = (uint)*local_b0 + *local_c0;
            local_c0 = local_c0 + 1;
          }
        }
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x1311a6);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x1311b8);
        findEdgePoints<double>
                  (in_stack_fffffffffffffde0,
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd8,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdc8,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdb8,SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0));
        if (local_20->direction == LEFT_TO_RIGHT) {
          if ((local_20->gradient == POSITIVE) || (local_20->gradient == ANY)) {
            auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,local_c);
            in_ZMM0 = ZEXT1664(auVar2);
            auVar2 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,local_10 + local_a4);
            auVar3 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,local_20->groupFactor - 1);
            fVar1 = auVar2._0_4_ + auVar3._0_4_ * 0.5;
            in_ZMM2 = ZEXT464((uint)fVar1);
            in_ZMM1 = ZEXT1664(CONCAT88(auVar2._8_8_,(double)fVar1));
            createPositiveXEdge<double>
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                       (double)in_stack_fffffffffffffdd0,(double)in_stack_fffffffffffffdc8);
          }
          if ((local_20->gradient == NEGATIVE) || (local_20->gradient == ANY)) {
            auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(local_c - 1) + local_14);
            in_ZMM0 = ZEXT1664(auVar2);
            auVar2 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,local_10 + local_a4);
            auVar3 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,local_20->groupFactor - 1);
            fVar1 = auVar2._0_4_ + auVar3._0_4_ * 0.5;
            in_ZMM2 = ZEXT464((uint)fVar1);
            in_ZMM1 = ZEXT1664(CONCAT88(auVar2._8_8_,(double)fVar1));
            createNegativeXEdge<double>
                      (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                       (double)in_stack_fffffffffffffde0,(double)in_stack_fffffffffffffdd8);
          }
        }
        else {
          if ((local_20->gradient == POSITIVE) || (local_20->gradient == ANY)) {
            auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(local_c - 1) + local_14);
            in_ZMM0 = ZEXT1664(auVar2);
            auVar2 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,local_10 + local_a4);
            auVar3 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,local_20->groupFactor - 1);
            fVar1 = auVar2._0_4_ + auVar3._0_4_ * 0.5;
            in_ZMM2 = ZEXT464((uint)fVar1);
            in_ZMM1 = ZEXT1664(CONCAT88(auVar2._8_8_,(double)fVar1));
            createNegativeXEdge<double>
                      (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                       (double)in_stack_fffffffffffffde0,(double)in_stack_fffffffffffffdd8);
          }
          if ((local_20->gradient == NEGATIVE) || (local_20->gradient == ANY)) {
            auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,local_c);
            in_ZMM0 = ZEXT1664(auVar2);
            auVar2 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,local_10 + local_a4);
            auVar3 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,local_20->groupFactor - 1);
            fVar1 = auVar2._0_4_ + auVar3._0_4_ * 0.5;
            in_ZMM2 = ZEXT464((uint)fVar1);
            in_ZMM1 = ZEXT1664(CONCAT88(auVar2._8_8_,(double)fVar1));
            createPositiveXEdge<double>
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                       (double)in_stack_fffffffffffffdd0,(double)in_stack_fffffffffffffdc8);
          }
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
        local_a0 = local_a0 + local_28 * local_20->skipFactor;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0);
    }
  }
  return;
}

Assistant:

void findEdgePoints( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, const EdgeParameter & edgeParameter,
                         std::vector < PointBase2D<_Type> > & positiveEdgePoint, std::vector < PointBase2D<_Type> > & negativeEdgePoint )
    {
        Image_Function::VerifyGrayScaleImage( image );
        Image_Function::ParameterValidation( image, x, y, width, height );
        edgeParameter.verify();

        const bool horizontalEdgeDetectionBase = (edgeParameter.direction == EdgeParameter::LEFT_TO_RIGHT || edgeParameter.direction == EdgeParameter::RIGHT_TO_LEFT);

        if ( (horizontalEdgeDetectionBase && (width  < 4u)) || (!horizontalEdgeDetectionBase && (height < 4u)) )
            return;

        const uint32_t rowSize = image.rowSize();

        if ( horizontalEdgeDetectionBase ) {
            std::vector < int > data            ( width );
            std::vector < int > firstDerivative ( width, 0 );
            std::vector < int > secondDerivative( width, 0 );

            const uint8_t * imageY = image.data() + y * rowSize + x;
            for ( uint32_t rowId = 0u; rowId < height - edgeParameter.groupFactor + 1u; rowId += edgeParameter.skipFactor, imageY += (rowSize * edgeParameter.skipFactor) ) {
                const uint8_t * imageX    = imageY;
                const uint8_t * imageXEnd = imageX + width;
                int * dataX = data.data();
                for ( ; imageX != imageXEnd; ++imageX, ++dataX )
                    *dataX = *imageX;

                for ( uint32_t groupId = 1u; groupId < edgeParameter.groupFactor; ++groupId ) {
                    imageX    = imageY + groupId * rowSize;
                    imageXEnd = imageX + width;
                    dataX = data.data();

                    for ( ; imageX != imageXEnd; ++imageX, ++dataX )
                        *dataX += *imageX;
                }

                std::vector< _Type > edgePositive;
                std::vector< _Type > edgeNegative;
                findEdgePoints( edgePositive, edgeNegative, data, firstDerivative, secondDerivative, edgeParameter, (edgeParameter.direction == EdgeParameter::LEFT_TO_RIGHT) );

                if ( edgeParameter.direction == EdgeParameter::LEFT_TO_RIGHT ) {
                    if ( edgeParameter.gradient == EdgeParameter::POSITIVE || edgeParameter.gradient == EdgeParameter::ANY )
                        createPositiveXEdge( edgePositive, positiveEdgePoint, static_cast<_Type>( x ),
                                             static_cast<_Type>(y + rowId + (edgeParameter.groupFactor - 1) / 2.0f ) );

                    if ( edgeParameter.gradient == EdgeParameter::NEGATIVE || edgeParameter.gradient == EdgeParameter::ANY )
                        createNegativeXEdge( edgeNegative, negativeEdgePoint, static_cast<_Type>( x + width - 1 ),
                                             static_cast<_Type>( y + rowId + (edgeParameter.groupFactor - 1) / 2.0f ) );
                }
                else {
                    if ( edgeParameter.gradient == EdgeParameter::POSITIVE || edgeParameter.gradient == EdgeParameter::ANY )
                        createNegativeXEdge( edgeNegative, positiveEdgePoint, static_cast<_Type>( x + width - 1 ),
                                             static_cast<_Type>( y + rowId + (edgeParameter.groupFactor - 1) / 2.0f ) );

                    if ( edgeParameter.gradient == EdgeParameter::NEGATIVE || edgeParameter.gradient == EdgeParameter::ANY )
                        createPositiveXEdge( edgePositive, negativeEdgePoint, static_cast<_Type>( x ),
                                             static_cast<_Type>( y + rowId + (edgeParameter.groupFactor - 1) / 2.0f ) );
                }
            }
        }
        else {
            std::vector < int > data            ( height );
            std::vector < int > firstDerivative ( height, 0 );
            std::vector < int > secondDerivative( height, 0 );

            const uint8_t * imageX = image.data() + y * rowSize + x;
            for ( uint32_t rowId = 0u; rowId < width - edgeParameter.groupFactor + 1u; rowId += edgeParameter.skipFactor, imageX += edgeParameter.skipFactor ) {
                const uint8_t * imageY    = imageX;
                const uint8_t * imageYEnd = imageY + height * rowSize;
                int * dataX = data.data();
                for ( ; imageY != imageYEnd; imageY += rowSize, ++dataX )
                    *dataX = *imageY;

                for ( uint32_t groupId = 1u; groupId < edgeParameter.groupFactor; ++groupId ) {
                    imageY    = imageX + groupId;
                    imageYEnd = imageY + height * rowSize;
                    dataX = data.data();

                    for ( ; imageY != imageYEnd; imageY += rowSize, ++dataX )
                        *dataX += *imageY;
                }

                std::vector< _Type > edgePositive;
                std::vector< _Type > edgeNegative;
                findEdgePoints( edgePositive, edgeNegative, data, firstDerivative, secondDerivative, edgeParameter, (edgeParameter.direction == EdgeParameter::TOP_TO_BOTTOM) );

                if ( edgeParameter.direction == EdgeParameter::TOP_TO_BOTTOM ) {
                    if ( edgeParameter.gradient == EdgeParameter::POSITIVE || edgeParameter.gradient == EdgeParameter::ANY )
                        createPositiveYEdge( edgePositive, positiveEdgePoint, static_cast<_Type>( x + rowId + (edgeParameter.groupFactor - 1) / 2.0f ),
                                             static_cast<_Type>( y ) );

                    if ( edgeParameter.gradient == EdgeParameter::NEGATIVE || edgeParameter.gradient == EdgeParameter::ANY )
                        createNegativeYEdge( edgeNegative, negativeEdgePoint, static_cast<_Type>( x + rowId + (edgeParameter.groupFactor - 1) / 2.0f ),
                                             static_cast<_Type>( y + height - 1 ) );
                }
                else {
                    if ( edgeParameter.gradient == EdgeParameter::POSITIVE || edgeParameter.gradient == EdgeParameter::ANY )
                        createNegativeYEdge( edgeNegative, positiveEdgePoint, static_cast<_Type>( x + rowId + (edgeParameter.groupFactor - 1) / 2.0f ),
                                             static_cast<_Type>( y + height - 1 ) );

                    if ( edgeParameter.gradient == EdgeParameter::NEGATIVE || edgeParameter.gradient == EdgeParameter::ANY )
                        createPositiveYEdge( edgePositive, negativeEdgePoint, static_cast<_Type>( x + rowId + (edgeParameter.groupFactor - 1) / 2.0f ),
                                             static_cast<_Type>( y ) );
                }
            }
        }
    }